

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::DWARFYAML::ARangeDescriptor,std::allocator<llvm::DWARFYAML::ARangeDescriptor>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,
          vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
          *Seq,bool param_3,EmptyContext *Ctx)

{
  _func_int **pp_Var1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  undefined8 local_40;
  void *SaveInfo;
  
  uVar3 = (**(code **)(*(long *)this + 0x18))();
  cVar2 = (**(code **)(*(long *)this + 0x10))(this);
  uVar4 = (uint)((ulong)((long)io->Ctxt - (long)io->_vptr_IO) >> 4);
  if (cVar2 == '\0') {
    uVar4 = uVar3;
  }
  if (uVar4 != 0) {
    pvVar5 = (void *)(ulong)uVar4;
    pvVar6 = (void *)0x0;
    SaveInfo = pvVar5;
    do {
      cVar2 = (**(code **)(*(long *)this + 0x20))(this,(ulong)pvVar6 & 0xffffffff,&local_40);
      if (cVar2 != '\0') {
        if ((void *)((long)io->Ctxt - (long)io->_vptr_IO >> 4) <= pvVar6) {
          std::
          vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
          ::resize((vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                    *)io,(long)pvVar6 + 1);
        }
        pp_Var1 = io->_vptr_IO;
        (**(code **)(*(long *)this + 0x68))(this);
        MappingTraits<llvm::DWARFYAML::ARangeDescriptor>::mapping
                  ((IO *)this,(ARangeDescriptor *)(pp_Var1 + (long)pvVar6 * 2));
        (**(code **)(*(long *)this + 0x70))(this);
        (**(code **)(*(long *)this + 0x28))(this,local_40);
        pvVar5 = SaveInfo;
      }
      pvVar6 = (void *)((long)pvVar6 + 1);
    } while (pvVar6 != pvVar5);
  }
  (**(code **)(*(long *)this + 0x30))(this);
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}